

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O3

QString * __thiscall
QCommandLineParser::value
          (QString *__return_storage_ptr__,QCommandLineParser *this,QString *optionName)

{
  Data *pDVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d->needsParsing == true) {
    value();
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  values((QStringList *)&local_48,this,optionName);
  if ((undefined1 *)local_48.size == (undefined1 *)0x0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar1 = local_48.ptr[(long)(local_48.size + -1)].d.d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = local_48.ptr[(long)(local_48.size + -1)].d.ptr;
    (__return_storage_ptr__->d).size = local_48.ptr[(long)(local_48.size + -1)].d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QCommandLineParser::value(const QString &optionName) const
{
    d->checkParsed("value");
    const QStringList valueList = values(optionName);

    if (!valueList.isEmpty())
        return valueList.last();

    return QString();
}